

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null_filter.cpp
# Opt level: O2

string * __thiscall
duckdb::IsNotNullFilter::ToString
          (string *__return_storage_ptr__,IsNotNullFilter *this,string *column_name)

{
  ::std::operator+(__return_storage_ptr__,column_name," IS NOT NULL");
  return __return_storage_ptr__;
}

Assistant:

string IsNotNullFilter::ToString(const string &column_name) const {
	return column_name + " IS NOT NULL";
}